

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_errmsg(sqlite3 *db)

{
  int iVar1;
  char *pcVar2;
  
  if (db == (sqlite3 *)0x0) {
    return "out of memory";
  }
  iVar1 = sqlite3SafetyCheckSickOrOk(db);
  if (iVar1 == 0) {
    iVar1 = sqlite3MisuseError(0x26561);
    pcVar2 = sqlite3ErrStr(iVar1);
    return pcVar2;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->mallocFailed == '\0') {
    if (db->errCode == 0) {
      iVar1 = 0;
    }
    else {
      pcVar2 = (char *)sqlite3_value_text(db->pErr);
      if ((uchar *)pcVar2 != (uchar *)0x0) goto LAB_001239f0;
      iVar1 = db->errCode;
    }
    pcVar2 = sqlite3ErrStr(iVar1);
  }
  else {
    pcVar2 = "out of memory";
  }
LAB_001239f0:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return (char *)(uchar *)pcVar2;
}

Assistant:

SQLITE_API const char *sqlite3_errmsg(sqlite3 *db){
  const char *z;
  if( !db ){
    return sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return sqlite3ErrStr(SQLITE_MISUSE_BKPT);
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }else{
    testcase( db->pErr==0 );
    z = db->errCode ? (char*)sqlite3_value_text(db->pErr) : 0;
    assert( !db->mallocFailed );
    if( z==0 ){
      z = sqlite3ErrStr(db->errCode);
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}